

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void object_suite::fail_trailing_separator(void)

{
  bool bVar1;
  error_code eVar2;
  char input [11];
  reader reader;
  uint local_17c;
  view_type local_178;
  char local_168 [16];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_168,"{\"key\":1,}",0xb);
  local_178._M_len = strlen(local_168);
  local_178._M_str = local_168;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_178);
  local_178._M_len = CONCAT44(local_178._M_len._4_4_,local_158.decoder.current.code);
  local_17c = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x342,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  local_178._M_len = trial::protocol::json::basic_reader<char>::level(&local_158);
  local_17c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x343,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_178._M_len = CONCAT71(local_178._M_len._1_7_,bVar1);
  local_17c = CONCAT31(local_17c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x344,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  local_178._M_len = CONCAT44(local_178._M_len._4_4_,local_158.decoder.current.code);
  local_17c = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x345,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  local_178._M_len = trial::protocol::json::basic_reader<char>::level(&local_158);
  local_17c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x346,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_178._M_len = CONCAT71(local_178._M_len._1_7_,bVar1);
  local_17c = CONCAT31(local_17c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x347,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  local_178._M_len = CONCAT44(local_178._M_len._4_4_,local_158.decoder.current.code);
  local_17c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x348,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  local_178._M_len = trial::protocol::json::basic_reader<char>::level(&local_158);
  local_17c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x349,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_178._M_len = CONCAT71(local_178._M_len._1_7_,bVar1);
  local_17c = local_17c & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x34a,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  eVar2 = trial::protocol::json::detail::basic_decoder<char>::error(&local_158.decoder);
  local_178._M_str = (char *)eVar2._M_cat;
  local_178._M_len = CONCAT44(local_178._M_len._4_4_,eVar2._M_value);
  local_17c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("reader.error()","json::unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x34b,"void object_suite::fail_trailing_separator()",&local_178,&local_17c);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void fail_trailing_separator()
{
    const char input[] = "{\"key\":1,}";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::unexpected_token);
}